

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O1

int check_host(char *hostname,void *sin_addr)

{
  int iVar1;
  undefined8 in_RAX;
  hostent *phVar2;
  in_addr addr;
  in_addr local_14;
  
  local_14.s_addr = (in_addr_t)((ulong)in_RAX >> 0x20);
  phVar2 = gethostbyname(hostname);
  if (phVar2 == (hostent *)0x0) {
    iVar1 = inet_aton(hostname,&local_14);
    if (iVar1 == 0) {
      return 0;
    }
    *(in_addr_t *)sin_addr = local_14.s_addr;
  }
  else {
    memcpy(sin_addr,*phVar2->h_addr_list,(long)phVar2->h_length);
  }
  return 1;
}

Assistant:

static int
check_host(char *hostname, void *sin_addr)
{
    struct hostent *host_addr;
    host_addr = gethostbyname(hostname);
    if (host_addr == NULL) {
	struct in_addr addr;
	if (inet_aton(hostname, &addr) == 0) {
	    /* 
	     *  not translatable as a hostname or 
	     * as a dot-style string IP address
	     */
	    return 0;
	}
	assert(sizeof(int) == sizeof(struct in_addr));
	*((int *) sin_addr) = *((int*) &addr);
    } else {
	memcpy(sin_addr, host_addr->h_addr, host_addr->h_length);
    }
    return 1;
}